

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtlsbackend.cpp
# Opt level: O0

QSslCipher QTlsBackend::createCiphersuite(QString *descriptionOneLine,int bits,int supportedBits)

{
  QChar c;
  QStringView s;
  QLatin1StringView s_00;
  QLatin1StringView s_01;
  QLatin1StringView s_02;
  bool bVar1;
  qsizetype qVar2;
  pointer pQVar3;
  const_reference pQVar4;
  const_reference n;
  int in_ECX;
  int in_EDX;
  unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_> in_RDI;
  long in_FS_OFFSET;
  QSslCipher *ciph;
  size_t RuntimeThreshold;
  size_t i;
  size_t RuntimeThreshold_3;
  size_t RuntimeThreshold_2;
  size_t RuntimeThreshold_1;
  size_t i_1;
  size_t i_2;
  size_t i_3;
  QStringView tail;
  QStringView protoString;
  QList<QStringView> descriptionList;
  undefined4 in_stack_fffffffffffffcd8;
  SplitBehaviorFlags in_stack_fffffffffffffcdc;
  undefined7 in_stack_fffffffffffffce0;
  undefined1 in_stack_fffffffffffffce7;
  undefined4 in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffcec;
  QStringView *in_stack_fffffffffffffcf0;
  undefined6 in_stack_fffffffffffffcf8;
  undefined1 in_stack_fffffffffffffcfe;
  undefined1 in_stack_fffffffffffffcff;
  byte bVar5;
  qsizetype in_stack_fffffffffffffd00;
  storage_type_conflict *in_stack_fffffffffffffd08;
  ulong local_1f8;
  ulong local_1b0;
  ulong local_198;
  ulong local_180;
  QChar local_9a;
  QStringView local_98;
  qsizetype local_60;
  storage_type_conflict *local_58;
  QChar local_32;
  undefined1 local_30 [16];
  QList<QStringView> local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined8 *)
   in_RDI._M_t.super___uniq_ptr_impl<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>.
   _M_t.super__Tuple_impl<0UL,_QSslCipherPrivate_*,_std::default_delete<QSslCipherPrivate>_>.
   super__Head_base<0UL,_QSslCipherPrivate_*,_false>._M_head_impl = 0xaaaaaaaaaaaaaaaa;
  QSslCipher::QSslCipher
            ((QSslCipher *)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0));
  local_20.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_20.d.ptr = (QStringView *)0xaaaaaaaaaaaaaaaa;
  local_20.d.size = -0x5555555555555556;
  QStringView::QStringView<QString,_true>
            (in_stack_fffffffffffffcf0,
             (QString *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
  QChar::QChar<char16_t,_true>(&local_32,L' ');
  QFlags<Qt::SplitBehaviorFlags>::QFlags
            ((QFlags<Qt::SplitBehaviorFlags> *)
             CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0),in_stack_fffffffffffffcdc
            );
  QStringView::split((QChar)(char16_t)&local_20,(QFlags_conflict *)local_30,
                     (uint)(ushort)local_32.ucs);
  qVar2 = QList<QStringView>::size(&local_20);
  if (5 < qVar2) {
    pQVar3 = std::unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>::operator->
                       ((unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_> *)
                        0x278bab);
    pQVar3->isNull = false;
    QList<QStringView>::at
              ((QList<QStringView> *)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0),
               CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
    QStringView::toString
              ((QStringView *)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0));
    std::unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>::operator->
              ((unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_> *)0x278bdc);
    QString::operator=((QString *)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0),
                       (QString *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
    QString::~QString((QString *)0x278bfd);
    local_60 = 0xaaaaaaaaaaaaaaaa;
    local_58 = (storage_type_conflict *)0xaaaaaaaaaaaaaaaa;
    pQVar4 = QList<QStringView>::at
                       ((QList<QStringView> *)
                        CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0),
                        CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
    local_60 = pQVar4->m_size;
    local_58 = pQVar4->m_data;
    QStringView::toString
              ((QStringView *)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0));
    std::unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>::operator->
              ((unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_> *)0x278c66);
    QString::operator=((QString *)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0),
                       (QString *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
    QString::~QString((QString *)0x278c87);
    pQVar3 = std::unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>::operator->
                       ((unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_> *)
                        0x278c94);
    pQVar3->protocol = UnknownProtocol;
    std::data<char16_t_const,6ul>((char16_t (*) [6])L"TLSv1");
    for (local_1f8 = 0; (local_1f8 < 6 && (L"TLSv1"[local_1f8] != L'\0')); local_1f8 = local_1f8 + 1
        ) {
    }
    QStringView::QStringView<char16_t,_true>
              (in_stack_fffffffffffffcf0,
               (char16_t *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
               CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0));
    s.m_data = in_stack_fffffffffffffd08;
    s.m_size = in_stack_fffffffffffffd00;
    bVar1 = QStringView::startsWith
                      ((QStringView *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                       s,CaseInsensitive);
    if (bVar1) {
      local_98.m_data = (storage_type_conflict *)0xaaaaaaaaaaaaaaaa;
      local_98.m_size = 0xaaaaaaaaaaaaaaaa;
      local_98 = QStringView::sliced(in_stack_fffffffffffffcf0,
                                     CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
      QChar::QChar<char16_t,_true>(&local_9a,L'.');
      c.ucs._1_1_ = in_stack_fffffffffffffcff;
      c.ucs._0_1_ = in_stack_fffffffffffffcfe;
      bVar1 = QStringView::startsWith(in_stack_fffffffffffffcf0,c);
      if (bVar1) {
        local_98 = QStringView::sliced(in_stack_fffffffffffffcf0,
                                       CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8)
                                      );
        std::data<char16_t_const,2ul>((char16_t (*) [2])L"3");
        for (local_1b0 = 0; (local_1b0 < 2 && (L"3"[local_1b0] != L'\0')); local_1b0 = local_1b0 + 1
            ) {
        }
        QStringView::QStringView<char16_t,_true>
                  (in_stack_fffffffffffffcf0,
                   (char16_t *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
                   CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0));
        bVar1 = ::operator==((QStringView *)
                             CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0),
                             (QStringView *)
                             CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
        if (bVar1) {
          pQVar3 = std::unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>::
                   operator->((unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>
                               *)0x278f6d);
          pQVar3->protocol = TlsV1_3;
        }
        else {
          std::data<char16_t_const,2ul>((char16_t (*) [2])0x3d6bb0);
          for (local_198 = 0; (local_198 < 2 && (L"unix+h2"[local_198 + 6] != L'\0'));
              local_198 = local_198 + 1) {
          }
          QStringView::QStringView<char16_t,_true>
                    (in_stack_fffffffffffffcf0,
                     (char16_t *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
                     CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0));
          bVar1 = ::operator==((QStringView *)
                               CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0),
                               (QStringView *)
                               CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
          if (bVar1) {
            pQVar3 = std::unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>::
                     operator->((unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>
                                 *)0x279089);
            pQVar3->protocol = TlsV1_2;
          }
          else {
            std::data<char16_t_const,2ul>((char16_t (*) [2])0x3cd456);
            for (local_180 = 0; (local_180 < 2 && (L"TLSv1"[local_180 + 4] != L'\0'));
                local_180 = local_180 + 1) {
            }
            QStringView::QStringView<char16_t,_true>
                      (in_stack_fffffffffffffcf0,
                       (char16_t *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
                       CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0));
            bVar1 = ::operator==((QStringView *)
                                 CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0),
                                 (QStringView *)
                                 CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
            if (bVar1) {
              pQVar3 = std::unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>::
                       operator->((unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>
                                   *)0x2791a5);
              pQVar3->protocol = TlsV1_1;
            }
          }
        }
      }
      else {
        bVar1 = QStringView::isEmpty((QStringView *)0x2791c2);
        if (bVar1) {
          pQVar3 = std::unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>::
                   operator->((unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>
                               *)0x2791d5);
          pQVar3->protocol = TlsV1_0;
        }
      }
    }
    QList<QStringView>::at
              ((QList<QStringView> *)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0),
               CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
    Qt::Literals::StringLiterals::operator____L1
              ((char *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
               CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0));
    s_00.m_data = (char *)in_stack_fffffffffffffd08;
    s_00.m_size = in_stack_fffffffffffffd00;
    bVar1 = QStringView::startsWith
                      ((QStringView *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                       s_00,CaseInsensitive);
    if (bVar1) {
      QList<QStringView>::at
                ((QList<QStringView> *)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0)
                 ,CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
      QStringView::mid((QStringView *)
                       CONCAT17(in_stack_fffffffffffffcff,
                                CONCAT16(in_stack_fffffffffffffcfe,in_stack_fffffffffffffcf8)),
                       (qsizetype)in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
      QStringView::toString
                ((QStringView *)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0));
      std::unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>::operator->
                ((unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_> *)0x279298)
      ;
      QString::operator=((QString *)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0),
                         (QString *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
      QString::~QString((QString *)0x2792b9);
    }
    pQVar4 = QList<QStringView>::at
                       ((QList<QStringView> *)
                        CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0),
                        CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
    Qt::Literals::StringLiterals::operator____L1
              ((char *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
               CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0));
    s_01.m_data = (char *)pQVar4;
    s_01.m_size = in_stack_fffffffffffffd00;
    bVar1 = QStringView::startsWith
                      ((QStringView *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                       s_01,CaseInsensitive);
    if (bVar1) {
      QList<QStringView>::at
                ((QList<QStringView> *)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0)
                 ,CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
      QStringView::mid((QStringView *)
                       CONCAT17(in_stack_fffffffffffffcff,
                                CONCAT16(in_stack_fffffffffffffcfe,in_stack_fffffffffffffcf8)),
                       (qsizetype)pQVar4,in_stack_fffffffffffffd00);
      QStringView::toString
                ((QStringView *)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0));
      std::unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>::operator->
                ((unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_> *)0x27936e)
      ;
      QString::operator=((QString *)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0),
                         (QString *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
      QString::~QString((QString *)0x27938f);
    }
    n = QList<QStringView>::at
                  ((QList<QStringView> *)
                   CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0),
                   CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
    Qt::Literals::StringLiterals::operator____L1
              ((char *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
               CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0));
    s_02.m_data = (char *)pQVar4;
    s_02.m_size = (qsizetype)n;
    bVar1 = QStringView::startsWith
                      ((QStringView *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                       s_02,CaseInsensitive);
    if (bVar1) {
      QList<QStringView>::at
                ((QList<QStringView> *)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0)
                 ,CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
      QStringView::mid((QStringView *)
                       CONCAT17(in_stack_fffffffffffffcff,
                                CONCAT16(in_stack_fffffffffffffcfe,in_stack_fffffffffffffcf8)),
                       (qsizetype)pQVar4,(qsizetype)n);
      QStringView::toString
                ((QStringView *)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0));
      std::unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>::operator->
                ((unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_> *)0x279444)
      ;
      QString::operator=((QString *)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0),
                         (QString *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
      QString::~QString((QString *)0x279465);
    }
    qVar2 = QList<QStringView>::size(&local_20);
    bVar5 = false;
    if (6 < qVar2) {
      QList<QStringView>::at
                ((QList<QStringView> *)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0)
                 ,CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
      Qt::Literals::StringLiterals::operator____L1
                ((char *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
                 CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0));
      bVar5 = ::operator==((QStringView *)
                           CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0),
                           (QLatin1StringView *)
                           CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
    }
    pQVar3 = std::unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>::operator->
                       ((unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_> *)
                        0x2794e4);
    pQVar3->exportable = (bool)(bVar5 & 1);
    pQVar3 = std::unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>::operator->
                       ((unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_> *)
                        0x279506);
    pQVar3->bits = in_EDX;
    pQVar3 = std::unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>::operator->
                       ((unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_> *)
                        0x279525);
    pQVar3->supportedBits = in_ECX;
  }
  QList<QStringView>::~QList((QList<QStringView> *)0x279541);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>)
           (unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>)
           in_RDI._M_t.
           super___uniq_ptr_impl<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>._M_t.
           super__Tuple_impl<0UL,_QSslCipherPrivate_*,_std::default_delete<QSslCipherPrivate>_>.
           super__Head_base<0UL,_QSslCipherPrivate_*,_false>._M_head_impl;
  }
  __stack_chk_fail();
}

Assistant:

QSslCipher QTlsBackend::createCiphersuite(const QString &descriptionOneLine, int bits, int supportedBits)
{
    QSslCipher ciph;

    const auto descriptionList = QStringView{descriptionOneLine}.split(u' ', Qt::SkipEmptyParts);
    if (descriptionList.size() > 5) {
        ciph.d->isNull = false;
        ciph.d->name = descriptionList.at(0).toString();

        QStringView protoString = descriptionList.at(1);
        ciph.d->protocolString = protoString.toString();
        ciph.d->protocol = QSsl::UnknownProtocol;
QT_WARNING_PUSH
QT_WARNING_DISABLE_DEPRECATED
        if (protoString.startsWith(u"TLSv1")) {
            QStringView tail = protoString.sliced(5);
            if (tail.startsWith(u'.')) {
                tail = tail.sliced(1);
                if (tail == u"3")
                    ciph.d->protocol = QSsl::TlsV1_3;
                else if (tail == u"2")
                    ciph.d->protocol = QSsl::TlsV1_2;
                else if (tail == u"1")
                    ciph.d->protocol = QSsl::TlsV1_1;
            } else if (tail.isEmpty()) {
                ciph.d->protocol = QSsl::TlsV1_0;
            }
        }
QT_WARNING_POP

        if (descriptionList.at(2).startsWith("Kx="_L1))
            ciph.d->keyExchangeMethod = descriptionList.at(2).mid(3).toString();
        if (descriptionList.at(3).startsWith("Au="_L1))
            ciph.d->authenticationMethod = descriptionList.at(3).mid(3).toString();
        if (descriptionList.at(4).startsWith("Enc="_L1))
            ciph.d->encryptionMethod = descriptionList.at(4).mid(4).toString();
        ciph.d->exportable = (descriptionList.size() > 6 && descriptionList.at(6) == "export"_L1);

        ciph.d->bits = bits;
        ciph.d->supportedBits = supportedBits;
    }

    return ciph;
}